

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.cpp
# Opt level: O1

double __thiscall spvtools::opt::analysis::Constant::GetDouble(Constant *this)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  double dVar2;
  
  iVar1 = (*this->type_->_vptr_Type[0xc])();
  if (CONCAT44(extraout_var,iVar1) != 0) {
    iVar1 = (*this->type_->_vptr_Type[0xc])();
    if (*(int *)(CONCAT44(extraout_var_00,iVar1) + 0x24) == 0x40) {
      iVar1 = (*this->_vptr_Constant[0xf])(this);
      if ((FloatConstant *)CONCAT44(extraout_var_01,iVar1) != (FloatConstant *)0x0) {
        dVar2 = FloatConstant::GetDoubleValue((FloatConstant *)CONCAT44(extraout_var_01,iVar1));
        return dVar2;
      }
      iVar1 = (*this->_vptr_Constant[0x16])(this);
      if (CONCAT44(extraout_var_02,iVar1) != 0) {
        return 0.0;
      }
      __assert_fail("AsNullConstant() && \"Must be a floating point constant.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/constants.cpp"
                    ,0x2a,"double spvtools::opt::analysis::Constant::GetDouble() const");
    }
  }
  __assert_fail("type()->AsFloat() != nullptr && type()->AsFloat()->width() == 64",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/constants.cpp"
                ,0x25,"double spvtools::opt::analysis::Constant::GetDouble() const");
}

Assistant:

double Constant::GetDouble() const {
  assert(type()->AsFloat() != nullptr && type()->AsFloat()->width() == 64);

  if (const FloatConstant* fc = AsFloatConstant()) {
    return fc->GetDoubleValue();
  } else {
    assert(AsNullConstant() && "Must be a floating point constant.");
    return 0.0;
  }
}